

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstsstore.cpp
# Opt level: O2

void __thiscall QHstsStore::synchronize(QHstsStore *this)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  QHstsPolicy *policy;
  QHstsPolicy *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char> local_70;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QSettings::isWritable();
  if (cVar1 != '\0') {
    if ((this->observedPolicies).d.size != 0) {
      beginHstsGroups(this);
      this_00 = (this->observedPolicies).d.ptr;
      for (lVar3 = (this->observedPolicies).d.size << 3; lVar3 != 0; lVar3 = lVar3 + -8) {
        local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QHstsPolicy::host((QString *)&local_a0,this_00,(ComponentFormattingOptions)0x7f00000);
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QString::toUtf8_helper((QString *)&local_70);
        QByteArray::toHex((char)&local_58);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
        QString::fromLatin1<void>((QString *)&local_88,(QByteArray *)&local_58);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
        bVar2 = QHstsPolicy::isExpired(this_00);
        if (bVar2) {
LAB_001c90e6:
          evictPolicy(this,(QString *)&local_88);
        }
        else {
          bVar2 = serializePolicy(this,(QString *)&local_88,this_00);
          if (!bVar2) goto LAB_001c90e6;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
        this_00 = this_00 + 1;
      }
      QList<QHstsPolicy>::clear(&this->observedPolicies);
      endHstsGroups(this);
    }
    QSettings::sync();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHstsStore::synchronize()
{
    if (!isWritable())
        return;

    if (observedPolicies.size()) {
        beginHstsGroups();
        for (const QHstsPolicy &policy : std::as_const(observedPolicies)) {
            const QString key(host_name_to_settings_key(policy.host()));
            // If we fail to write a new, updated policy, we also remove the old one.
            if (policy.isExpired() || !serializePolicy(key, policy))
                evictPolicy(key);
        }
        observedPolicies.clear();
        endHstsGroups();
    }

    store.sync();
}